

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.h
# Opt level: O0

void __thiscall
chrono::ChLinkMotorRotationSpeed::SetSpeedFunction
          (ChLinkMotorRotationSpeed *this,shared_ptr<chrono::ChFunction> *function)

{
  shared_ptr<chrono::ChFunction> local_28;
  shared_ptr<chrono::ChFunction> *local_18;
  shared_ptr<chrono::ChFunction> *function_local;
  ChLinkMotorRotationSpeed *this_local;
  
  local_18 = function;
  function_local = (shared_ptr<chrono::ChFunction> *)this;
  std::shared_ptr<chrono::ChFunction>::shared_ptr(&local_28,function);
  ChLinkMotor::SetMotorFunction((ChLinkMotor *)this,&local_28);
  std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_28);
  return;
}

Assistant:

void SetSpeedFunction(const std::shared_ptr<ChFunction> function) { SetMotorFunction(function); }